

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadServiceWrapperBase.cpp
# Opt level: O2

void __thiscall ThreadServiceWrapperBase::ScheduleFinishConcurrent(ThreadServiceWrapperBase *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  DWORD DVar4;
  undefined4 *puVar5;
  ThreadContext *pTVar6;
  char16_t *pcVar7;
  
  pTVar6 = this->threadContext;
  if (pTVar6->callRootLevel != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadServiceWrapperBase.cpp"
                       ,0x106,"(!threadContext->IsInScript())","!threadContext->IsInScript()");
    if (!bVar2) goto LAB_00728b48;
    *puVar5 = 0;
    pTVar6 = this->threadContext;
  }
  BVar3 = Memory::Recycler::CollectionInProgress(pTVar6->recycler);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadServiceWrapperBase.cpp"
                       ,0x107,"(threadContext->GetRecycler()->CollectionInProgress())",
                       "threadContext->GetRecycler()->CollectionInProgress()");
    if (!bVar2) {
LAB_00728b48:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (this->inIdleCollect != false) {
    return;
  }
  if (DAT_0145948a == '\x01') {
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,IdleCollectPhase);
    if (bVar2) {
      DVar4 = GetCurrentThreadId();
      pcVar7 = L"scheduled finish";
      if (this->needIdleCollect != false) {
        pcVar7 = L"reschedule finish";
      }
      Output::Print(L"%04X> Idle collect %s\n",(ulong)DVar4,pcVar7);
      Output::Flush();
    }
  }
  this->needIdleCollect = false;
  ScheduleIdleCollect(this,100,true);
  return;
}

Assistant:

void ThreadServiceWrapperBase::ScheduleFinishConcurrent()
{
    Assert(!threadContext->IsInScript());
    Assert(threadContext->GetRecycler()->CollectionInProgress());

    if (!this->inIdleCollect)
    {
        IDLE_COLLECT_VERBOSE_TRACE(_u("Idle collect %s\n"), needIdleCollect ? _u("reschedule finish") : _u("scheduled finish"));
        this->needIdleCollect = false;
        ScheduleIdleCollect(IdleFinishTicks, true /* schedule as task */);
    }
}